

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

void __thiscall Bstrlib::CBString::join(CBString *this,CBStringList *l,CBString *sep)

{
  int iVar1;
  CBString *b;
  const_reference pvVar2;
  CBStringException *pCVar3;
  int len;
  ulong uVar4;
  allocator local_c1;
  CBString *local_c0;
  CBStringException bstr__cppwrapper_exception;
  string local_90;
  string local_70;
  string local_50;
  
  if ((this->super_tagbstring).mlen < 1) {
    std::__cxx11::string::string((string *)&local_50,"CBString::Write protection error",&local_c1);
    CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    pCVar3 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar3,&bstr__cppwrapper_exception);
    __cxa_throw(pCVar3,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  iVar1 = (sep->super_tagbstring).slen;
  len = 1;
  uVar4 = 0;
  local_c0 = sep;
  do {
    if ((ulong)((*(long *)(l + 8) - *(long *)l) / 0x18) <= uVar4) {
      alloc(this,len);
      b = local_c0;
      (this->super_tagbstring).slen = 0;
      if ((this->super_tagbstring).data != (uchar *)0x0) {
        for (uVar4 = 0; uVar4 < (ulong)((*(long *)(l + 8) - *(long *)l) / 0x18); uVar4 = uVar4 + 1)
        {
          if (uVar4 != 0) {
            operator+=(this,b);
          }
          pvVar2 = std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::at
                             ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)l,
                              uVar4);
          operator+=(this,pvVar2);
        }
        return;
      }
      (this->super_tagbstring).mlen = 0;
      std::__cxx11::string::string
                ((string *)&local_90,"CBString::Failure in (CBStringList) constructor",&local_c1);
      CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      pCVar3 = (CBStringException *)__cxa_allocate_exception(0x28);
      CBStringException::CBStringException(pCVar3,&bstr__cppwrapper_exception);
      __cxa_throw(pCVar3,&CBStringException::typeinfo,CBStringException::~CBStringException);
    }
    pvVar2 = std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::at
                       ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)l,uVar4);
    len = len + iVar1 + (pvVar2->super_tagbstring).slen;
    uVar4 = uVar4 + 1;
  } while (iVar1 <= len);
  std::__cxx11::string::string
            ((string *)&local_70,"CBString::Failure in (CBStringList) constructor, too long",
             &local_c1);
  CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  pCVar3 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(pCVar3,&bstr__cppwrapper_exception);
  __cxa_throw(pCVar3,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

void CBString::join (const struct CBStringList& l, const CBString& sep) {
int c, sl = sep.length();
size_t i;

	if (mlen <= 0) {
		bstringThrow ("Write protection error");
	}

	for (c=1, i=0; i < l.size(); i++) {
		c += l.at(i).slen + sl;
		if (c < sl) bstringThrow ("Failure in (CBStringList) constructor, too long");
	}

	alloc (c);
	slen = 0;
	if (!data) {
		mlen = slen = 0;
		bstringThrow ("Failure in (CBStringList) constructor");
	} else {
		for (i=0; i < l.size(); i++) {
			if (i > 0) *this += sep;
			*this += l.at(i);
		}
	}
}